

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::PrintTimeScaleTask::checkArguments
          (PrintTimeScaleTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  long lVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,0,1);
  lVar4 = 400;
  if ((bVar2) && (lVar4 = 0x188, (args->_M_extent)._M_extent_value != 0)) {
    pTVar3 = (Type *)(ulong)**(uint **)(*args->_M_ptr + 1);
    if ((pTVar3 < (Type *)0x30) && ((0x80000000000aU >> ((ulong)pTVar3 & 0x3f) & 1) != 0)) {
      bVar2 = true;
    }
    else {
      bVar2 = Scope::isUninstantiated((context->scope).ptr);
      if (!bVar2) {
        ASTContext::addDiag(context,(DiagCode)0xb000b,(*args->_M_ptr)->sourceRange);
      }
      pTVar3 = pCVar1->errorType;
      bVar2 = false;
    }
    if (!bVar2) {
      return pTVar3;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar4);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 1))
            return comp.getErrorType();

        if (args.size() > 0) {
            auto& sym = *args[0]->as<ArbitrarySymbolExpression>().symbol;
            if (sym.kind != SymbolKind::Instance && sym.kind != SymbolKind::CompilationUnit &&
                sym.kind != SymbolKind::Root) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleName, args[0]->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }